

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_print_syntaxv_ds(arg_dstr_t ds,void **argtable,char *suffix)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  char *str;
  long lVar5;
  char syntax [200];
  char *in_stack_fffffffffffffef8;
  char local_f8 [200];
  
  pbVar4 = (byte *)*argtable;
  if (pbVar4 != (byte *)0x0) {
    lVar5 = 0;
    do {
      if ((*pbVar4 & 1) != 0) break;
      memset(local_f8,0,200);
      arg_cat_optionv(local_f8,*(size_t *)(pbVar4 + 8),*(char **)(pbVar4 + 0x10),
                      *(char **)(pbVar4 + 0x18),(char *)(ulong)(*pbVar4 & 4),0x10de11,
                      in_stack_fffffffffffffef8);
      pvVar1 = argtable[lVar5];
      iVar2 = *(int *)((long)pvVar1 + 0x28);
      if (0 < iVar2) {
        iVar3 = 0;
        do {
          arg_dstr_cat(ds," ");
          arg_dstr_cat(ds,local_f8);
          iVar3 = iVar3 + 1;
          pvVar1 = argtable[lVar5];
          iVar2 = *(int *)((long)pvVar1 + 0x28);
        } while (iVar3 < iVar2);
      }
      iVar3 = *(int *)((long)pvVar1 + 0x2c) - iVar2;
      if (*(int *)((long)pvVar1 + 0x2c) != iVar2) {
        str = "]";
        if (iVar3 != 1) {
          if (iVar3 == 2) {
            arg_dstr_cat(ds," [");
            arg_dstr_cat(ds,local_f8);
            str = "]";
            arg_dstr_cat(ds,"]");
          }
          else {
            str = "]...";
          }
        }
        arg_dstr_cat(ds," [");
        arg_dstr_cat(ds,local_f8);
        arg_dstr_cat(ds,str);
      }
      pbVar4 = (byte *)argtable[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (pbVar4 != (byte *)0x0);
  }
  if (suffix != (char *)0x0) {
    arg_dstr_cat(ds,suffix);
  }
  return;
}

Assistant:

void arg_print_syntaxv_ds(arg_dstr_t ds, void** argtable, const char* suffix) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int i, tabindex;

    /* print remaining options in abbreviated style */
    for (tabindex = 0; table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        char syntax[200] = "";
        const char *shortopts, *longopts, *datatype;

        shortopts = table[tabindex]->shortopts;
        longopts = table[tabindex]->longopts;
        datatype = table[tabindex]->datatype;
        arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE, "|");

        /* print mandatory options */
        for (i = 0; i < table[tabindex]->mincount; i++) {
            arg_dstr_cat(ds, " ");
            arg_dstr_cat(ds, syntax);
        }

        /* print optional args enclosed in "[..]" */
        switch (table[tabindex]->maxcount - table[tabindex]->mincount) {
            case 0:
                break;
            case 1:
                arg_dstr_cat(ds, " [");
                arg_dstr_cat(ds, syntax);
                arg_dstr_cat(ds, "]");
                break;
            case 2:
                arg_dstr_cat(ds, " [");
                arg_dstr_cat(ds, syntax);
                arg_dstr_cat(ds, "]");
                arg_dstr_cat(ds, " [");
                arg_dstr_cat(ds, syntax);
                arg_dstr_cat(ds, "]");
                break;
            default:
                arg_dstr_cat(ds, " [");
                arg_dstr_cat(ds, syntax);
                arg_dstr_cat(ds, "]...");
                break;
        }
    }

    if (suffix) {
        arg_dstr_cat(ds, (char*)suffix);
    }
}